

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall
mp::SolveResultRegistry::AddSolveResults(SolveResultRegistry *this,SRRegMap *sm,bool ifCanReplace)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  Error *this_00;
  int *in_R8;
  _Rb_tree_header *p_Var3;
  int local_58;
  _Rb_tree_color local_54;
  string local_50;
  
  p_Var2 = (sm->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(sm->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      if (!ifCanReplace) {
        iVar1 = std::
                _Rb_tree<mp::SolveResultRegistry::RegEntry,_mp::SolveResultRegistry::RegEntry,_std::_Identity<mp::SolveResultRegistry::RegEntry>,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
                ::find(&(this->registry_)._M_t,(key_type *)(p_Var2 + 1));
        if (&(this->registry_)._M_t._M_impl.super__Rb_tree_header !=
            (_Rb_tree_header *)iVar1._M_node) {
          this_00 = (Error *)__cxa_allocate_exception(0x18);
          local_54 = p_Var2[1]._M_color;
          local_58 = *(int *)&p_Var2[1].field_0x4;
          fmt::format<int,int>
                    (&local_50,(fmt *)"Duplicated solve code range {}-{}",(CStringRef)&local_54,
                     &local_58,in_R8);
          Error::Error(this_00,(CStringRef)local_50._M_dataplus._M_p,-1);
          __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
        }
      }
      std::
      _Rb_tree<mp::SolveResultRegistry::RegEntry,mp::SolveResultRegistry::RegEntry,std::_Identity<mp::SolveResultRegistry::RegEntry>,std::less<mp::SolveResultRegistry::RegEntry>,std::allocator<mp::SolveResultRegistry::RegEntry>>
      ::_M_insert_unique<mp::SolveResultRegistry::RegEntry_const&>
                ((_Rb_tree<mp::SolveResultRegistry::RegEntry,mp::SolveResultRegistry::RegEntry,std::_Identity<mp::SolveResultRegistry::RegEntry>,std::less<mp::SolveResultRegistry::RegEntry>,std::allocator<mp::SolveResultRegistry::RegEntry>>
                  *)&this->registry_,(key_type *)(p_Var2 + 1));
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void SolveResultRegistry::AddSolveResults(
    const SRRegMap &sm, bool ifCanReplace) {
  for (const auto& sr : sm) {
    if (!ifCanReplace  // Fail unless ifCanReplace
        && registry_.end()!=registry_.find(sr))
      MP_RAISE(fmt::format(
                 "Duplicated solve code range {}-{}",
                 sr.first(), sr.last()));
    registry_.insert(sr);
  }
}